

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::MaterialNode> *mnode)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 id;
  MaterialNode *pMVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict1 *pmVar5;
  OBJMaterial *pOVar6;
  ostream *poVar7;
  ThinDielectricMaterial *pTVar8;
  DielectricMaterial *pDVar9;
  runtime_error *this_00;
  Node *pNVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  Ref<embree::SceneGraph::Node> node;
  key_type local_b8;
  long local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  Ref<embree::DielectricMaterial> local_70;
  undefined1 local_68 [16];
  Ref<embree::ThinDielectricMaterial> local_58;
  Ref<embree::OBJMaterial> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->referenceMaterials == true) {
    if (this->ident != 0) {
      uVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
        uVar12 = uVar12 + 1;
      } while (uVar12 < this->ident);
    }
    std::operator+(&local_48,"<material id=\"",&(mnode->ptr->super_Node).name);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    pNVar10 = (Node *)(plVar3 + 2);
    if ((Node *)*plVar3 == pNVar10) {
      local_a8._0_8_ = (pNVar10->super_RefCount)._vptr_RefCount;
      local_a8._8_8_ = plVar3[3];
      local_b8.ptr = (Node *)local_a8;
    }
    else {
      local_a8._0_8_ = (pNVar10->super_RefCount)._vptr_RefCount;
      local_b8.ptr = (Node *)*plVar3;
    }
    local_b0 = plVar3[1];
    *plVar3 = (long)pNVar10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->field_0x10,(char *)local_b8.ptr,local_b0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (local_b8.ptr != (Node *)local_a8) {
      operator_delete(local_b8.ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
    operator_delete(local_48._M_dataplus._M_p);
    return;
  }
  pNVar10 = &mnode->ptr->super_Node;
  local_b8.ptr = pNVar10;
  if (pNVar10 != (Node *)0x0) {
    (*(((Node *)&pNVar10->super_RefCount)->super_RefCount)._vptr_RefCount[2])(pNVar10);
  }
  p_Var4 = (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var1->_M_header;
    do {
      if (*(Node **)(p_Var4 + 1) >= pNVar10) {
        p_Var11 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(Node **)(p_Var4 + 1) < pNVar10];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var11 != p_Var1) && (*(Node **)(p_Var11 + 1) <= pNVar10)) {
      if (this->ident != 0) {
        uVar12 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar12 = uVar12 + 1;
        } while (uVar12 < this->ident);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->field_0x10,"<material id=\"",0xe);
      std::
      map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
      ::operator[](&this->nodeMap,&local_b8);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"/>",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      goto LAB_0019789c;
    }
  }
  id = this->currentNodeID;
  this->currentNodeID = id + 1;
  pmVar5 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
           ::operator[](&this->nodeMap,&local_b8);
  *pmVar5 = id;
  pMVar2 = mnode->ptr;
  if (pMVar2 != (MaterialNode *)0x0) {
    pOVar6 = (OBJMaterial *)
             __dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,&OBJMaterial::typeinfo,0);
    if (pOVar6 == (OBJMaterial *)0x0) {
      pTVar8 = (ThinDielectricMaterial *)
               __dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                              &ThinDielectricMaterial::typeinfo,0);
      if (pTVar8 == (ThinDielectricMaterial *)0x0) {
        plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                        &MetalMaterial::typeinfo,0);
        if (plVar3 == (long *)0x0) {
          plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                          &VelvetMaterial::typeinfo,0);
          if (plVar3 == (long *)0x0) {
            pDVar9 = (DielectricMaterial *)
                     __dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                    &DielectricMaterial::typeinfo,0);
            if (pDVar9 == (DielectricMaterial *)0x0) {
              plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                              &MetallicPaintMaterial::typeinfo,0);
              if (plVar3 == (long *)0x0) {
                plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                                &MatteMaterial::typeinfo,0);
                if (plVar3 == (long *)0x0) {
                  plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                                  &MirrorMaterial::typeinfo,0);
                  if (plVar3 == (long *)0x0) {
                    plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                                    &MetalMaterial::typeinfo,0);
                    if (plVar3 == (long *)0x0) {
                      plVar3 = (long *)__dynamic_cast(pMVar2,&SceneGraph::MaterialNode::typeinfo,
                                                      &HairMaterial::typeinfo,0);
                      if (plVar3 == (long *)0x0) goto LAB_001978bc;
                      (**(code **)(*plVar3 + 0x10))(plVar3);
                      local_a8._16_8_ = plVar3;
                      (**(code **)(*plVar3 + 0x10))(plVar3);
                      store(this,(Ref<embree::HairMaterial> *)(local_a8 + 0x10),id);
                      (**(code **)(*plVar3 + 0x18))(plVar3);
                      (**(code **)(*plVar3 + 0x18))(plVar3);
                    }
                    else {
                      (**(code **)(*plVar3 + 0x10))(plVar3);
                      local_a8._24_8_ = plVar3;
                      (**(code **)(*plVar3 + 0x10))(plVar3);
                      store(this,(Ref<embree::MetalMaterial> *)(local_a8 + 0x18),id);
                      (**(code **)(*plVar3 + 0x18))(plVar3);
                      (**(code **)(*plVar3 + 0x18))(plVar3);
                    }
                  }
                  else {
                    (**(code **)(*plVar3 + 0x10))(plVar3);
                    local_88._0_8_ = plVar3;
                    (**(code **)(*plVar3 + 0x10))(plVar3);
                    store(this,(Ref<embree::MirrorMaterial> *)local_88,id);
                    (**(code **)(*plVar3 + 0x18))(plVar3);
                    (**(code **)(*plVar3 + 0x18))(plVar3);
                  }
                }
                else {
                  (**(code **)(*plVar3 + 0x10))(plVar3);
                  local_88._8_8_ = plVar3;
                  (**(code **)(*plVar3 + 0x10))(plVar3);
                  store(this,(Ref<embree::MatteMaterial> *)(local_88 + 8),id);
                  (**(code **)(*plVar3 + 0x18))(plVar3);
                  (**(code **)(*plVar3 + 0x18))(plVar3);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x10))(plVar3);
                local_78._M_p = (pointer)plVar3;
                (**(code **)(*plVar3 + 0x10))(plVar3);
                store(this,(Ref<embree::MetallicPaintMaterial> *)&local_78,id);
                (**(code **)(*plVar3 + 0x18))(plVar3);
                (**(code **)(*plVar3 + 0x18))(plVar3);
              }
            }
            else {
              (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pDVar9);
              local_70.ptr = pDVar9;
              (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pDVar9);
              store(this,&local_70,id);
              (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pDVar9);
              (*(pDVar9->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pDVar9);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x10))(plVar3);
            local_68._0_8_ = plVar3;
            (**(code **)(*plVar3 + 0x10))(plVar3);
            store(this,(Ref<embree::VelvetMaterial> *)local_68,id);
            (**(code **)(*plVar3 + 0x18))(plVar3);
            (**(code **)(*plVar3 + 0x18))(plVar3);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x10))(plVar3);
          local_68._8_8_ = plVar3;
          (**(code **)(*plVar3 + 0x10))(plVar3);
          store(this,(Ref<embree::MetalMaterial> *)(local_68 + 8),id);
          (**(code **)(*plVar3 + 0x18))(plVar3);
          (**(code **)(*plVar3 + 0x18))(plVar3);
        }
      }
      else {
        (*(pTVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar8);
        local_58.ptr = pTVar8;
        (*(pTVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pTVar8);
        store(this,&local_58,id);
        (*(pTVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar8);
        (*(pTVar8->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pTVar8);
      }
    }
    else {
      (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar6);
      local_50.ptr = pOVar6;
      (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar6);
      store(this,&local_50,id);
      (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar6);
      (*(pOVar6->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar6);
    }
LAB_0019789c:
    if (local_b8.ptr != (Node *)0x0) {
      (*(((Node *)&(local_b8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    return;
  }
LAB_001978bc:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unsupported material");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::MaterialNode> mnode)
  {
    /* let materials reference by their name, allows separate bindings of materials */
    if (referenceMaterials) {
      tab(); xml << "<material id=\""+mnode->name+"\"/>" << std::endl;
      return;
    }
    
    Ref<SceneGraph::Node> node = mnode.dynamicCast<SceneGraph::Node>();
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<material id=\"" << nodeMap[node] << "\"/>" << std::endl;
      return;
    }
    const ssize_t id = nodeMap[node] = currentNodeID++;

    if      (Ref<OBJMaterial> m = mnode.dynamicCast<OBJMaterial>()) store(m,id);
    else if (Ref<ThinDielectricMaterial> m = mnode.dynamicCast<ThinDielectricMaterial>()) store(m,id);
    else if (Ref<MetalMaterial> m = mnode.dynamicCast<MetalMaterial>()) store(m,id);
    else if (Ref<VelvetMaterial> m = mnode.dynamicCast<VelvetMaterial>()) store(m,id);
    else if (Ref<DielectricMaterial> m = mnode.dynamicCast<DielectricMaterial>()) store(m,id);
    else if (Ref<MetallicPaintMaterial> m = mnode.dynamicCast<MetallicPaintMaterial>()) store(m,id);
    else if (Ref<MatteMaterial> m = mnode.dynamicCast<MatteMaterial>()) store(m,id);
    else if (Ref<MirrorMaterial> m = mnode.dynamicCast<MirrorMaterial>()) store(m,id);
    else if (Ref<ReflectiveMetalMaterial> m = mnode.dynamicCast<ReflectiveMetalMaterial>()) store(m,id);
    else if (Ref<HairMaterial> m = mnode.dynamicCast<HairMaterial>()) store(m,id);
    else throw std::runtime_error("unsupported material");
  }